

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacent_find_suite.cpp
# Opt level: O0

void find_array_string(void)

{
  bool bVar1;
  iterator *other;
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_200;
  iterator local_1f8;
  iterator local_1e0;
  iterator local_1c8;
  iterator local_1b0;
  undefined4 local_194;
  iterator local_190;
  iterator local_178;
  difference_type local_160 [2];
  iterator local_150;
  iterator local_138;
  iterator local_120;
  undefined1 local_108 [8];
  iterator where;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,"bravo");
  local_48._0_8_ = &local_d8;
  local_48._8_8_ = 3;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_200 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_200 = local_200 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_200);
  } while (local_200 != &local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_120,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_138,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::adjacent_find<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_108,&local_120,&local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_120);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_150,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_108,&local_150);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/adjacent_find_suite.cpp"
             ,0x82,"void find_array_string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_150);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_178,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_190,(iterator *)local_108);
  local_160[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_178,&local_190);
  local_194 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/adjacent_find_suite.cpp"
             ,0x83,"void find_array_string()",local_160,&local_194);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_190);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_178);
  other = trial::dynamic::basic_variable<std::allocator<char>_>::
          iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
          ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                        *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator(&local_1c8,other);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::adjacent_find<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            (&local_1b0,&local_1c8,&local_1e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator=
            ((iterator *)local_108,&local_1b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1f8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_108,&local_1f8);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/adjacent_find_suite.cpp"
             ,0x85,"void find_array_string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void find_array_string()
{
    variable data = array::make({ "alpha", "bravo", "bravo" });
    auto where = std::adjacent_find(data.begin(), data.end());
    TRIAL_PROTOCOL_TEST(where != data.end());
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    where = std::adjacent_find(++where, data.end());
    TRIAL_PROTOCOL_TEST(where == data.end());
}